

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpScanner.cpp
# Opt level: O2

void __thiscall glslang::TPpContext::missingEndifCheck(TPpContext *this)

{
  TParseContextBase *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  TSourceLoc *pTVar1;
  
  if (0 < this->ifdepth) {
    this_00 = this->parseContext;
    pTVar1 = TParseVersions::getCurrentLoc(&this_00->super_TParseVersions);
    UNRECOVERED_JUMPTABLE = (this_00->super_TParseVersions)._vptr_TParseVersions[0x2f];
    (*UNRECOVERED_JUMPTABLE)(this_00,pTVar1,"missing #endif","","",UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void TPpContext::missingEndifCheck()
{
    if (ifdepth > 0)
        parseContext.ppError(parseContext.getCurrentLoc(), "missing #endif", "", "");
}